

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdsplitter.cpp
# Opt level: O0

void __thiscall mdsplit::mdsplitter::find_sections(mdsplitter *this)

{
  pointer *__pred;
  bool bVar1;
  byte bVar2;
  istream *piVar3;
  const_reference pvVar4;
  difference_type dVar5;
  char *pcVar6;
  pointer pmVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  ulong uVar9;
  reference pvVar10;
  pointer pmVar11;
  string_view str;
  string_view str_00;
  undefined1 auVar12 [16];
  path local_598;
  path local_570;
  undefined1 local_548 [8];
  mdsection new_section_1;
  undefined1 local_4c0 [7];
  bool found_text_before_any_section;
  undefined1 local_498 [16];
  string local_488;
  undefined1 local_468 [16];
  string local_458;
  reference local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *parent_section;
  iterator __end6;
  iterator __begin6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  path local_3f0;
  undefined1 local_3c1;
  iterator iStack_3c0;
  bool first_section;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3b8;
  const_iterator local_3b0;
  vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> local_3a8;
  undefined1 local_390 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
  it;
  undefined1 local_378 [4];
  int i;
  undefined1 local_358 [8];
  mdsection new_section;
  short level;
  bool found_header;
  smatch sm;
  undefined1 local_2a8 [6];
  bool inside_ignoreblock;
  bool inside_codeblock;
  string current_line;
  ifstream fin;
  undefined1 local_80 [8];
  regex ignore_end_regex;
  undefined1 local_50 [8];
  regex ignore_begin_regex;
  regex header_regex;
  mdsplitter *this_local;
  
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
             &ignore_begin_regex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,"(^|\\n)(#+) +(.*)",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,
             " *<!-- START mdsplit-ignore --> *",0x10);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80,
             " *<!-- END mdsplit-ignore --> *",0x10);
  std::ifstream::ifstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            ((ifstream *)(current_line.field_2._M_local_buf + 8),&this->input_,_S_in);
  std::__cxx11::string::string((string *)local_2a8);
  sm._M_begin._M_current._7_1_ = 0;
  sm._M_begin._M_current._6_1_ = 0;
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(current_line.field_2._M_local_buf + 8),(string *)local_2a8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_2a8);
      std::ifstream::~ifstream((void *)((long)&current_line.field_2 + 8));
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 &ignore_begin_regex._M_automaton.
                  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      return;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)&level);
    bVar1 = is_codeblock((string *)local_2a8);
    if (bVar1) {
      sm._M_begin._M_current._7_1_ = (sm._M_begin._M_current._7_1_ & 1) != 1;
    }
    if ((sm._M_begin._M_current._7_1_ & 1) == 0) {
      bVar1 = std::
              regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2a8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_50,
                         0);
      if (bVar1) {
        sm._M_begin._M_current._6_1_ = 1;
        new_section.filepath._M_cmpts._M_impl._M_t.
        super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        ._M_t.
        super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
        _4_4_ = 2;
      }
      else {
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2a8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_80,0);
        if (bVar1) {
          sm._M_begin._M_current._6_1_ = 0;
          new_section.filepath._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
          ._4_4_ = 2;
        }
        else {
          if ((sm._M_begin._M_current._6_1_ & 1) == 0) {
            new_section.filepath._M_cmpts._M_impl._M_t.
            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            ._M_t.
            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
            .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
            _M_head_impl._3_1_ =
                 std::
                 regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2a8,
                            (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&level,
                            (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                            &ignore_begin_regex._M_automaton.
                             super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount,0);
            if ((bool)new_section.filepath._M_cmpts._M_impl._M_t.
                      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                      _M_head_impl._3_1_) {
              pvVar4 = std::__cxx11::
                       match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&level,2);
              dVar5 = std::__cxx11::
                      sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::length(pvVar4);
              new_section.filepath._M_cmpts._M_impl._M_t.
              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              ._M_t.
              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
              .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
              _M_head_impl._0_2_ = (short)dVar5;
              pmVar11 = (pointer)(ulong)(uint)(int)this->max_split_level_;
              if ((int)(short)new_section.filepath._M_cmpts._M_impl._M_t.
                              super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                              .
                              super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                              ._M_head_impl <= (int)this->max_split_level_) {
                mdsection::mdsection((mdsection *)local_358);
                local_358._0_2_ =
                     (short)new_section.filepath._M_cmpts._M_impl._M_t.
                            super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                            .
                            super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                            ._M_head_impl;
                pvVar4 = std::__cxx11::
                         match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&level,3);
                std::__cxx11::
                sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::str((string_type *)local_378,pvVar4);
                std::__cxx11::string::operator=((string *)&new_section,(string *)local_378);
                std::__cxx11::string::~string((string *)local_378);
                while( true ) {
                  bVar2 = std::__cxx11::string::empty();
                  pmVar11 = (pointer)CONCAT71((int7)((ulong)pmVar11 >> 8),bVar2);
                  bVar1 = false;
                  if ((bVar2 & 1) == 0) {
                    pcVar6 = (char *)std::__cxx11::string::back();
                    bVar1 = *pcVar6 == ' ';
                  }
                  if (!bVar1) break;
                  std::__cxx11::string::pop_back();
                }
                it.current._M_current._4_4_ = (int)(short)local_358._0_2_;
                while (it.current._M_current._4_4_ = it.current._M_current._4_4_ + -1,
                      1 < it.current._M_current._4_4_) {
                  std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::rbegin
                            ((vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *)
                             local_390);
                  __pred = &local_3a8.
                            super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::rend
                            ((vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_> *)
                             __pred);
                  pmVar11 = (pointer)((long)&it.current._M_current + 4);
                  local_3a8.
                  super__Vector_base<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>.
                  _M_impl.super__Vector_impl_data._M_finish = pmVar11;
                  std::
                  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection*,std::vector<mdsplit::mdsection,std::allocator<mdsplit::mdsection>>>>,mdsplit::mdsplitter::find_sections()::__0>
                            ((reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                              *)(local_390 + 8),
                             (reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                              *)local_390,(anon_class_8_1_54a39809_for__M_pred)__pred);
                  std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::rend
                            (&local_3a8);
                  bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                                           *)(local_390 + 8),
                                          (reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                                           *)&local_3a8);
                  if (bVar1) {
                    pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)((long)&new_section.header_name.field_2 + 8);
                    local_3b8._M_current =
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(pvVar8);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ::__normal_iterator<std::__cxx11::string*>
                              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                *)&local_3b0,&local_3b8);
                    pmVar7 = std::
                             reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<mdsplit::mdsection_*,_std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>_>_>
                                           *)(local_390 + 8));
                    iStack_3c0 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::insert(pvVar8,local_3b0,&pmVar7->header_name);
                  }
                }
                local_3c1 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::
                            empty(&this->sections_);
                if ((bool)local_3c1) {
                  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                            ((path *)&__range6,(char (*) [9])"index.md",auto_format);
                  std::filesystem::__cxx11::operator/
                            (&local_3f0,&this->output_dir_,(path *)&__range6);
                  std::filesystem::__cxx11::path::operator=
                            ((path *)&new_section.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_3f0)
                  ;
                  std::filesystem::__cxx11::path::~path(&local_3f0);
                  std::filesystem::__cxx11::path::~path((path *)&__range6);
                  std::__cxx11::string::operator=((string *)&new_section,"Home");
                }
                else {
                  std::filesystem::__cxx11::path::operator=
                            ((path *)&new_section.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             &this->output_dir_);
                  pvVar8 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&new_section.header_name.field_2 + 8);
                  __end6 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::begin(pvVar8);
                  parent_section =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(pvVar8);
                  while( true ) {
                    bVar1 = __gnu_cxx::operator!=
                                      (&__end6,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                *)&parent_section);
                    if (!bVar1) break;
                    local_438 = __gnu_cxx::
                                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator*(&__end6);
                    auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                        ((string *)local_438);
                    str._M_len = auVar12._8_8_;
                    str._M_str = (char *)pmVar11;
                    local_468 = auVar12;
                    slugify_abi_cxx11_(&local_458,auVar12._0_8_,str);
                    std::filesystem::__cxx11::path::operator/=
                              ((path *)&new_section.lines.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               &local_458);
                    std::__cxx11::string::~string((string *)&local_458);
                    __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator++(&__end6);
                  }
                  auVar12 = std::__cxx11::string::operator_cast_to_basic_string_view
                                      ((string *)&new_section);
                  str_00._M_len = auVar12._8_8_;
                  str_00._M_str = (char *)pmVar11;
                  local_498 = auVar12;
                  slugify_abi_cxx11_(&local_488,auVar12._0_8_,str_00);
                  std::filesystem::__cxx11::path::operator/=
                            ((path *)&new_section.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_488)
                  ;
                  std::__cxx11::string::~string((string *)&local_488);
                  std::filesystem::__cxx11::path::operator+=
                            ((path *)&new_section.lines.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,".md");
                }
                std::filesystem::__cxx11::path::parent_path();
                std::filesystem::create_directory((path *)local_4c0);
                std::filesystem::__cxx11::path::~path((path *)local_4c0);
                std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                          (&this->sections_,(value_type *)local_358);
                mdsection::~mdsection((mdsection *)local_358);
              }
            }
            goto LAB_00158605;
          }
          new_section.filepath._M_cmpts._M_impl._M_t.
          super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          ._M_t.
          super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl
          ._4_4_ = 2;
        }
      }
    }
    else {
LAB_00158605:
      new_section_1.filepath._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _7_1_ = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::empty
                        (&this->sections_);
      if ((bool)new_section_1.filepath._M_cmpts._M_impl._M_t.
                super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                ._M_t.
                super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                _M_head_impl._7_1_) {
        uVar9 = std::__cxx11::string::empty();
        if ((uVar9 & 1) == 0) {
          mdsection::mdsection((mdsection *)local_548);
          local_548._0_2_ = 0;
          std::__cxx11::string::operator=((string *)&new_section_1,"");
          std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                    (&local_598,(char (*) [9])"index.md",auto_format);
          std::filesystem::__cxx11::operator/(&local_570,&this->output_dir_,&local_598);
          std::filesystem::__cxx11::path::operator=
                    ((path *)&new_section_1.lines.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_570);
          std::filesystem::__cxx11::path::~path(&local_570);
          std::filesystem::__cxx11::path::~path(&local_598);
          std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::push_back
                    (&this->sections_,(value_type *)local_548);
          mdsection::~mdsection((mdsection *)local_548);
        }
      }
      bVar1 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::empty
                        (&this->sections_);
      if (!bVar1) {
        pvVar10 = std::vector<mdsplit::mdsection,_std::allocator<mdsplit::mdsection>_>::back
                            (&this->sections_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pvVar10->lines,(value_type *)local_2a8);
      }
      new_section.filepath._M_cmpts._M_impl._M_t.
      super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      ._M_t.
      super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
      .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl.
      _4_4_ = 0;
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&level);
  } while( true );
}

Assistant:

void mdsplitter::find_sections() {
        // # some text
        std::regex header_regex{"(^|\\n)(#+) +(.*)"};

        std::regex ignore_begin_regex{R"( *<!-- START mdsplit-ignore --> *)"};
        std::regex ignore_end_regex{R"( *<!-- END mdsplit-ignore --> *)"};

        /*
         * # some text
         * std::regex h1_regex{"# +(.*)"};
         * // ## some text
         * std::regex h2_regex{"## +(.*)"};
         * // ### some text
         * std::regex h3_regex{"### +(.*)"};
         */
        std::ifstream fin(input_);

        std::string current_line;
        bool inside_codeblock = false;
        bool inside_ignoreblock = false;

        while (std::getline(fin, current_line)) {
            std::smatch sm;

            if (is_codeblock(current_line)) {
                inside_codeblock = 1 - inside_codeblock;
            }

            if (!inside_codeblock) {
                if (std::regex_match(current_line, ignore_begin_regex)) {
                    inside_ignoreblock = true;
                    continue;
                } else if (std::regex_match(current_line, ignore_end_regex)) {
                    inside_ignoreblock = false;
                    continue;
                }
                if (inside_ignoreblock) {
                    continue;
                }

                bool found_header =
                    std::regex_search(current_line, sm, header_regex);
                if (found_header) {
                    short level = sm[2].length();
                    if (level <= max_split_level_) {
                        // Create new section
                        mdsection new_section;
                        new_section.level = level;
                        new_section.header_name = sm[3].str();
                        while (!new_section.header_name.empty() &&
                               new_section.header_name.back() == ' ') {
                            new_section.header_name.pop_back();
                        }

                        // Find its parent headers
                        // For each level below this section's (ignoring level
                        // 1)
                        for (int i = new_section.level - 1; i > 1; --i) {
                            // Find some section with this lower level
                            auto it = std::find_if(sections_.rbegin(),
                                                   sections_.rend(),
                                                   [&i](const mdsection &s) {
                                                       return s.level == i;
                                                   });
                            // If we found it
                            if (it != sections_.rend()) {
                                // Then this is the parent
                                new_section.parent_headers.insert(
                                    new_section.parent_headers.begin(),
                                    it->header_name);
                            }
                        }
                        bool first_section = sections_.empty();
                        if (first_section) {
                            new_section.filepath = output_dir_ / "index.md";
                            new_section.header_name = "Home";
                        } else {
                            new_section.filepath = output_dir_;
                            for (const auto &parent_section :
                                 new_section.parent_headers) {
                                new_section.filepath /= slugify(parent_section);
                            }
                            new_section.filepath /=
                                slugify(new_section.header_name);
                            new_section.filepath += ".md";
                        }
                        fs::create_directory(
                            new_section.filepath.parent_path());
                        sections_.push_back(new_section);
                    }
                }
            }

            // Make sure there's at least one default section
            bool found_text_before_any_section = sections_.empty();
            if (found_text_before_any_section && !current_line.empty()) {
                mdsection new_section;
                new_section.level = 0;
                new_section.header_name = "";
                new_section.filepath = output_dir_ / "index.md";
                sections_.push_back(new_section);
            }

            // Store line
            if (!sections_.empty()) {
                sections_.back().lines.push_back(std::move(current_line));
            }
        }
    }